

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::~TextureFilterMinmaxUtils(TextureFilterMinmaxUtils *this)

{
  pointer pSVar1;
  pointer pRVar2;
  pointer ppSVar3;
  
  ppSVar3 = (this->m_supportedTextureTypes).
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar3 !=
      (this->m_supportedTextureTypes).
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppSVar3 != (SupportedTextureType *)0x0) {
        (*(*ppSVar3)->_vptr_SupportedTextureType[3])();
      }
      ppSVar3 = ppSVar3 + 1;
    } while (ppSVar3 !=
             (this->m_supportedTextureTypes).
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppSVar3 = (this->m_supportedTextureTypes).
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3,(long)(this->m_supportedTextureTypes).
                                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3
                   );
  }
  pSVar1 = (this->m_supportedTextureDataTypes).
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_supportedTextureDataTypes).
                                 super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pRVar2 = (this->m_reductionModeParams).
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2,(long)(this->m_reductionModeParams).
                                 super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar2);
    return;
  }
  return;
}

Assistant:

TextureFilterMinmaxUtils::~TextureFilterMinmaxUtils()
{
	for (SupportedTextureTypeIter iter = m_supportedTextureTypes.begin(); iter != m_supportedTextureTypes.end(); ++iter)
	{
		SupportedTextureType* textureType = *iter;
		delete textureType;
	}
}